

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O0

void __thiscall crnlib::qdxt5::~qdxt5(qdxt5 *this)

{
  clusterizer<crnlib::vec<2U,_float>_> *pcVar1;
  clusterizer<crnlib::vec<2U,_float>_> *in_RDI;
  threaded_clusterizer<crnlib::vec<16U,_float>_> *this_00;
  
  spinlock::~spinlock((spinlock *)0x18ac5f);
  hash_map<crnlib::qdxt5::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt5::cluster_id>,_crnlib::equal_to<crnlib::qdxt5::cluster_id>_>
  ::~hash_map((hash_map<crnlib::qdxt5::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt5::cluster_id>,_crnlib::equal_to<crnlib::qdxt5::cluster_id>_>
               *)in_RDI);
  pcVar1 = in_RDI + 0x14;
  this_00 = (threaded_clusterizer<crnlib::vec<16U,_float>_> *)&in_RDI[0x38].m_right_children;
  do {
    this_00 = (threaded_clusterizer<crnlib::vec<16U,_float>_> *)
              ((long)(this_00 + 0xffffffffffffffff) + 0x1e0);
    vector<crnlib::vector<unsigned_int>_>::~vector((vector<crnlib::vector<unsigned_int>_> *)in_RDI);
  } while (this_00 != (threaded_clusterizer<crnlib::vec<16U,_float>_> *)&pcVar1->m_codebook);
  threaded_clusterizer<crnlib::vec<16U,_float>_>::~threaded_clusterizer(this_00);
  vector<crnlib::vector<unsigned_int>_>::~vector((vector<crnlib::vector<unsigned_int>_> *)in_RDI);
  clusterizer<crnlib::vec<2U,_float>_>::~clusterizer(in_RDI);
  return;
}

Assistant:

qdxt5::~qdxt5() {
}